

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::type_caster<char,_void>::cast
                 (char *src,return_value_policy policy,handle parent)

{
  _Alloc_hider _Var1;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (src == (char *)0x0) {
    none::none((none *)&local_38);
    _Var1._M_p = local_38._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)0x0;
    object::~object((object *)&local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,src,&local_39);
    _Var1._M_p = (pointer)string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ::cast(&local_38,policy,parent);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (handle)(PyObject *)_Var1._M_p;
}

Assistant:

static handle cast(const CharT *src, return_value_policy policy, handle parent) {
        if (src == nullptr) {
            return pybind11::none().release();
        }
        return StringCaster::cast(StringType(src), policy, parent);
    }